

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::reportError(Parser *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Parser *in_stack_ffffffffffffff68;
  string local_60 [48];
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  getFilename_abi_cxx11_(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in ");
    getFilename_abi_cxx11_(in_stack_ffffffffffffff68);
    poVar2 = std::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void Parser::reportError(const std::string& s)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << s << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << s << std::endl;
}